

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::RepeatedPrimitiveFieldGenerator::
RepeatedPrimitiveFieldGenerator
          (RepeatedPrimitiveFieldGenerator *this,FieldDescriptor *descriptor,Params *params)

{
  Params *descriptor_00;
  Params local_108;
  Params *local_20;
  Params *params_local;
  FieldDescriptor *descriptor_local;
  RepeatedPrimitiveFieldGenerator *this_local;
  
  local_20 = params;
  params_local = (Params *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  FieldGenerator::FieldGenerator(&this->super_FieldGenerator,params);
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__RepeatedPrimitiveFieldGenerator_006f7658;
  this->descriptor_ = (FieldDescriptor *)params_local;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_);
  descriptor_00 = params_local;
  Params::Params(&local_108,local_20);
  anon_unknown_5::SetPrimitiveVariables
            ((FieldDescriptor *)descriptor_00,&local_108,&this->variables_);
  Params::~Params(&local_108);
  return;
}

Assistant:

RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator(
    const FieldDescriptor* descriptor, const Params& params)
  : FieldGenerator(params), descriptor_(descriptor) {
  SetPrimitiveVariables(descriptor, params, &variables_);
}